

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Bias_x86_fma::forward_inplace(Bias_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  long lVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  lVar2 = *(long *)(&this->field_0xd8 + (long)this->_vptr_Bias_x86_fma[-3]);
  uVar16 = 0;
  uVar14 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar14 = uVar16;
  }
  for (; uVar16 != uVar14; uVar16 = uVar16 + 1) {
    pvVar3 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = bottom_top_blob->cstep;
    pauVar15 = (undefined1 (*) [16])(sVar5 * uVar16 * sVar4 + (long)pvVar3);
    fVar1 = *(float *)(lVar2 + uVar16 * 4);
    auVar20._4_4_ = fVar1;
    auVar20._0_4_ = fVar1;
    auVar20._8_4_ = fVar1;
    auVar20._12_4_ = fVar1;
    lVar17 = 0;
    for (iVar19 = 0; iVar19 + 7 < iVar13; iVar19 = iVar19 + 8) {
      fVar6 = *(float *)((long)*pauVar15 + 4);
      fVar7 = *(float *)((long)*pauVar15 + 8);
      fVar8 = *(float *)((long)*pauVar15 + 0xc);
      fVar9 = *(float *)pauVar15[1];
      fVar10 = *(float *)(pauVar15[1] + 4);
      fVar11 = *(float *)(pauVar15[1] + 8);
      fVar12 = *(float *)(pauVar15[1] + 0xc);
      *(float *)*pauVar15 = fVar1 + *(float *)*pauVar15;
      *(float *)((long)*pauVar15 + 4) = fVar1 + fVar6;
      *(float *)((long)*pauVar15 + 8) = fVar1 + fVar7;
      *(float *)((long)*pauVar15 + 0xc) = fVar1 + fVar8;
      *(float *)pauVar15[1] = fVar1 + fVar9;
      *(float *)(pauVar15[1] + 4) = fVar1 + fVar10;
      *(float *)(pauVar15[1] + 8) = fVar1 + fVar11;
      *(float *)(pauVar15[1] + 0xc) = fVar1 + fVar12;
      pauVar15 = pauVar15 + 2;
      lVar17 = lVar17 + 8;
    }
    auVar20 = vshufps_avx(auVar20,auVar20,0);
    for (; iVar19 + 3 < iVar13; iVar19 = iVar19 + 4) {
      auVar21._0_4_ = auVar20._0_4_ + *(float *)*pauVar15;
      auVar21._4_4_ = auVar20._4_4_ + *(float *)((long)*pauVar15 + 4);
      auVar21._8_4_ = auVar20._8_4_ + *(float *)((long)*pauVar15 + 8);
      auVar21._12_4_ = auVar20._12_4_ + *(float *)((long)*pauVar15 + 0xc);
      *pauVar15 = auVar21;
      pauVar15 = pauVar15 + 1;
      lVar17 = lVar17 + 4;
    }
    lVar18 = sVar5 * sVar4 * uVar16;
    for (; (int)lVar17 < iVar13; lVar17 = lVar17 + 1) {
      *(float *)((long)pvVar3 + lVar17 * 4 + lVar18) =
           fVar1 + *(float *)((long)pvVar3 + lVar17 * 4 + lVar18);
    }
  }
  return 0;
}

Assistant:

int Bias_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    const float* bias_ptr = bias_data;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_ptr[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        {
            __m256 _bias256 = _mm256_set1_ps(bias);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = _mm256_add_ps(_p, _bias256);
                _mm256_storeu_ps(ptr, _outp);

                ptr += 8;
            }
        }
#endif // __AVX__
        {
            __m128 _bias = _mm_set1_ps(bias);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = _mm_add_ps(_p, _bias);
                _mm_storeu_ps(ptr, _outp);

                ptr += 4;
            }
        }
#endif // __SSE2__

        for (; i < size; i++)
        {
            *ptr = *ptr + bias;

            ptr++;
        }
    }

    return 0;
}